

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_stream_extract(char *stream,size_t size,char *dir,_func_int_char_ptr_void_ptr *on_extract,
                      void *arg)

{
  mz_bool mVar1;
  undefined1 local_a8 [8];
  mz_zip_archive zip_archive;
  void *arg_local;
  _func_int_char_ptr_void_ptr *on_extract_local;
  char *dir_local;
  size_t size_local;
  char *stream_local;
  
  if ((stream == (char *)0x0) || (dir == (char *)0x0)) {
    stream_local._4_4_ = -1;
  }
  else {
    zip_archive.m_pState = (mz_zip_internal_state *)arg;
    memset(local_a8,0,0x70);
    if (&stack0x00000000 == (undefined1 *)0xa8) {
      stream_local._4_4_ = -7;
    }
    else {
      mVar1 = mz_zip_reader_init_mem((mz_zip_archive *)local_a8,stream,size,0);
      if (mVar1 == 0) {
        stream_local._4_4_ = -1;
      }
      else {
        stream_local._4_4_ =
             zip_archive_extract((mz_zip_archive *)local_a8,dir,on_extract,zip_archive.m_pState);
      }
    }
  }
  return stream_local._4_4_;
}

Assistant:

int zip_stream_extract(const char *stream, size_t size, const char *dir,
                       int (*on_extract)(const char *filename, void *arg),
                       void *arg) {
  mz_zip_archive zip_archive;
  if (!stream || !dir) {
    // Cannot parse zip archive stream
    return ZIP_ENOINIT;
  }
  if (!memset(&zip_archive, 0, sizeof(mz_zip_archive))) {
    // Cannot memset zip archive
    return ZIP_EMEMSET;
  }
  if (!mz_zip_reader_init_mem(&zip_archive, stream, size, 0)) {
    // Cannot initialize zip_archive reader
    return ZIP_ENOINIT;
  }

  return zip_archive_extract(&zip_archive, dir, on_extract, arg);
}